

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

int main(int argc,char **argv)

{
  __u8 *p_Var1;
  bool bVar2;
  __time_t _Var3;
  uint __i;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  bool bVar13;
  long local_110;
  timeval local_108;
  long local_f0;
  timeval timeo;
  sockaddr_can addr;
  timeval start_tv;
  fd_set rdfs;
  
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  for (lVar7 = 0; lVar7 != 0xac000; lVar7 = lVar7 + 0x158) {
    p_Var1 = sniftab[0].last.data + lVar7 + -0x40;
    *p_Var1 = *p_Var1 | 1;
  }
  bVar13 = false;
switchD_0010156d_caseD_71:
  bVar2 = bVar13;
  uVar4 = getopt(argc,argv,"r:t:h:l:f:qeb8Bc?");
  bVar13 = true;
  switch(uVar4) {
  case 0x62:
    goto LAB_00101675;
  case 99:
    color = 1;
    bVar13 = bVar2;
    goto switchD_0010156d_caseD_71;
  case 100:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x73:
switchD_0010156d_caseD_64:
    fprintf(_stderr,"Unknown option %c\n",(ulong)uVar4);
    bVar13 = bVar2;
    goto switchD_0010156d_caseD_71;
  case 0x65:
    print_eff = 1;
    bVar13 = bVar2;
    goto switchD_0010156d_caseD_71;
  case 0x66:
    __isoc99_sscanf(_optarg,"%ld",&canfd_mode);
    bVar13 = bVar2;
    if (1 < (ulong)canfd_mode) {
      canfd_mode = 2;
    }
    goto switchD_0010156d_caseD_71;
  case 0x68:
    plVar11 = &hold;
    break;
  case 0x6c:
    plVar11 = &loop;
    break;
  case 0x71:
    goto switchD_0010156d_caseD_71;
  case 0x72:
    goto switchD_0010156d_caseD_72;
  case 0x74:
    plVar11 = &timeout;
    break;
  default:
    if (uVar4 == 0x38) {
      binary8 = 1;
      vdl = "|";
LAB_00101675:
      binary = 1;
      binary_gap = 0;
      bVar13 = bVar2;
    }
    else {
      if (uVar4 != 0x42) {
        if (uVar4 == 0xffffffff) {
          lVar7 = (long)_optind;
          if (_optind != argc) {
            if (bVar2) {
              for (lVar10 = 0; lVar10 != 0xac000; lVar10 = lVar10 + 0x158) {
                p_Var1 = sniftab[0].last.data + lVar10 + -0x40;
                *p_Var1 = *p_Var1 & 0xfe;
              }
            }
            pcVar9 = argv[lVar7];
            sVar8 = strlen(pcVar9);
            if (sVar8 < 0x10) {
              interface = pcVar9;
              uVar4 = socket(0x1d,3,1);
              if ((int)uVar4 < 0) {
                pcVar9 = "socket";
              }
              else {
                addr.can_family = 0x1d;
                addr.can_ifindex = 0;
                pcVar9 = argv[_optind];
                iVar5 = strcmp("any",pcVar9);
                if ((iVar5 == 0) ||
                   (addr.can_ifindex = if_nametoindex(pcVar9), addr.can_ifindex != 0)) {
                  if (canfd_mode != 0) {
                    rdfs.fds_bits[0]._0_4_ = 1;
                    iVar5 = setsockopt(uVar4,0x65,5,&rdfs,4);
                    if (iVar5 != 0) {
                      puts("error when enabling CAN FD support");
                      return 1;
                    }
                    max_dlen = 1;
                    name_sep = 1;
                    print_ascii = 0;
                  }
                  iVar5 = bind(uVar4,(sockaddr *)&addr,0x18);
                  if (iVar5 < 0) {
                    perror("bind");
                    close(uVar4);
                    return iVar5;
                  }
                  local_110 = 0;
                  gettimeofday((timeval *)&start_tv,(__timezone_ptr_t)0x0);
                  local_108.tv_sec = 0;
                  local_108.tv_usec = 0;
                  printf("%s","\x1b[?25l");
                  uVar12 = 1L << ((byte)uVar4 & 0x3f);
                  local_f0 = start_tv.tv_sec;
                  do {
                    bVar13 = running == 0;
                    while( true ) {
                      if (bVar13) {
                        printf("%s","\x1b[?25h");
                        close(uVar4);
                        if (signal_num == 0) {
                          return iVar5;
                        }
                        return signal_num + 0x80;
                      }
                      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
                        rdfs.fds_bits[lVar7] = 0;
                      }
                      rdfs.fds_bits[0]._0_4_ = (uint)rdfs.fds_bits[0] | 1;
                      rdfs.fds_bits[uVar4 >> 6] = rdfs.fds_bits[uVar4 >> 6] | uVar12;
                      timeo.tv_sec = 0;
                      timeo.tv_usec = loop * 10000;
                      iVar5 = select(uVar4 + 1,(fd_set *)&rdfs,(fd_set *)0x0,(fd_set *)0x0,
                                     (timeval *)&timeo);
                      if (-1 < iVar5) break;
                      running = 0;
                      bVar13 = true;
                    }
                    gettimeofday(&local_108,(__timezone_ptr_t)0x0);
                    _Var3 = local_108.tv_sec;
                    lVar7 = local_108.tv_usec / 10000;
                    if (((uint)rdfs.fds_bits[0] & 1) != 0) {
                      uVar6 = handle_keyb();
                      running = running & uVar6;
                    }
                    lVar7 = (_Var3 - local_f0) * 100 + lVar7;
                    if ((rdfs.fds_bits[uVar4 >> 6] & uVar12) != 0) {
                      uVar6 = handle_frame(uVar4,lVar7);
                      running = running & uVar6;
                    }
                    iVar5 = 0;
                    if (loop <= lVar7 - local_110) {
                      handle_timeo(lVar7);
                      running = running & 1;
                      iVar5 = 0;
                      local_110 = lVar7;
                    }
                  } while( true );
                }
                pcVar9 = "if_nametoindex";
                addr.can_ifindex = 0;
              }
              perror(pcVar9);
            }
            else {
              printf("name of CAN device \'%s\' is too long!\n",pcVar9);
            }
            return 1;
          }
LAB_001019c9:
          pcVar9 = __xpg_basename(*argv);
          print_usage(pcVar9);
          exit(0);
        }
        if (uVar4 == 0x3f) goto LAB_001019c9;
        goto switchD_0010156d_caseD_64;
      }
      binary = 1;
      binary_gap = 1;
      bVar13 = bVar2;
    }
    goto switchD_0010156d_caseD_71;
  }
  __isoc99_sscanf(_optarg,"%ld",plVar11);
  bVar13 = bVar2;
  goto switchD_0010156d_caseD_71;
switchD_0010156d_caseD_72:
  iVar5 = readsettings(_optarg);
  bVar13 = bVar2;
  if (iVar5 < 0) {
    fprintf(_stderr,"Unable to read setting file \'%s%s\'!\n","sniffset.",_optarg);
    exit(1);
  }
  goto switchD_0010156d_caseD_71;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	long currcms = 0;
	long lastcms = 0;
	unsigned char quiet = 0;
	int opt, ret = 0;
	struct timeval timeo, start_tv, tv;
	struct sockaddr_can addr;
	int i;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	for (i = 0; i < MAX_SLOTS ;i++) /* default: enable all slots */
		do_set(i, ENABLE);

	while ((opt = getopt(argc, argv, "r:t:h:l:f:qeb8Bc?")) != -1) {
		switch (opt) {
		case 'r':
			if (readsettings(optarg) < 0) {
				fprintf(stderr, "Unable to read setting file '%s%s'!\n", SETFNAME, optarg);
				exit(1);
			}
			break;

		case 't':
			sscanf(optarg, "%ld", &timeout);
			break;

		case 'h':
			sscanf(optarg, "%ld", &hold);
			break;

		case 'l':
			sscanf(optarg, "%ld", &loop);
			break;

		case 'f':
			sscanf(optarg, "%ld", &canfd_mode);
			if ((canfd_mode != CANFD_ON) && (canfd_mode != CANFD_OFF))
				canfd_mode = CANFD_AUTO;
			break;

		case 'q':
			quiet = 1;
			break;

		case 'e':
			print_eff = 1;
			break;

		case 'b':
			binary = 1;
			binary_gap = 0;
			break;

		case '8':
			binary = 1;
			binary8 = 1; /* enable variable delimiter for EFF */
			switchvdl(SDL); /* switch directly to short delimiter */
			binary_gap = 0;
			break;

		case 'B':
			binary = 1;
			binary_gap = 1;
			break;

		case 'c':
			color = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			break;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if (quiet)
		for (i = 0; i < MAX_SLOTS; i++)
			do_clr(i, ENABLE);

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("name of CAN device '%s' is too long!\n", argv[optind]);
		return 1;
	}

	interface = argv[optind];

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = 0; /* 'any' CAN interface */

	/* check for specific CAN interface */
	if (strcmp(ANYDEV, argv[optind]) != 0) {
		addr.can_ifindex = if_nametoindex(argv[optind]);
		if (!addr.can_ifindex) {
			perror("if_nametoindex");
			return 1;
		}
	}

	/* enable CAN FD if not disabled by command line option */
	if (canfd_mode != CANFD_OFF) {
		const int enable_canfd = 1;

		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
			       &enable_canfd, sizeof(enable_canfd))){
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* might be changed in CANFD_AUTO mode */
		max_dlen = CANFD_MAX_DLEN;
		name_sep = FD_SEP;
		print_ascii = 0; /* don't print ASCII for CAN FD by default */
	}

	ret = bind(s, (struct sockaddr *)&addr, sizeof(addr));
	if (ret < 0) {
		perror("bind");
		close(s);
		return ret;
	}

	gettimeofday(&start_tv, NULL);
	tv.tv_sec = tv.tv_usec = 0;

	printf("%s", CSR_HIDE); /* hide cursor */

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(0, &rdfs);
		FD_SET(s, &rdfs);

		timeo.tv_sec  = 0;
		timeo.tv_usec = 10000 * loop;

		ret = select(s+1, &rdfs, NULL, NULL, &timeo);
		if (ret < 0) {
			//perror("select");
			running = 0;
			continue;
		} else
			ret = 0;

		gettimeofday(&tv, NULL);
		currcms = (tv.tv_sec - start_tv.tv_sec) * 100 + (tv.tv_usec / 10000);

		if (FD_ISSET(0, &rdfs))
			running &= handle_keyb();

		if (FD_ISSET(s, &rdfs))
			running &= handle_frame(s, currcms);

		if (currcms - lastcms >= loop) {
			running &= handle_timeo(currcms);
			lastcms = currcms;
		}
	}

	printf("%s", CSR_SHOW); /* show cursor */

	close(s);

	if (signal_num)
		return 128 + signal_num;

	return ret;
}